

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

string * __thiscall
findstr::guidstring_abi_cxx11_(string *__return_storage_ptr__,findstr *this,uint8_t *p)

{
  guid *g;
  uint8_t *p_local;
  
  stringformat<unsigned_int_const&,unsigned_short_const&,unsigned_short_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
            (__return_storage_ptr__,"%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x",(uint *)this,
             (unsigned_short *)&this->firstmatch,(unsigned_short *)&this->pattern_is_guid,
             (uchar *)&this->verbose,(uchar *)((long)&this->verbose + 1),
             (uchar *)((long)&this->verbose + 2),(uchar *)((long)&this->verbose + 3),
             &this->list_only,&this->count_only,&this->readcontinuous,&this->use_sequential);
  return __return_storage_ptr__;
}

Assistant:

static std::string guidstring(const uint8_t *p)
    {
        struct guid {
            uint32_t a;
            uint16_t b;
            uint16_t c;
            uint8_t  d[8];
        };
        const guid *g = (const guid*)p;
        return stringformat("%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x",
                g->a, g->b, g->c, g->d[0], g->d[1],
                g->d[2], g->d[3], g->d[4], g->d[5], g->d[6], g->d[7]);
    }